

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsers.h
# Opt level: O2

Result<wasm::Ok> *
wasm::WATParser::makeConst<wasm::WATParser::ParseDeclsCtx>
          (Result<wasm::Ok> *__return_storage_ptr__,ParseDeclsCtx *ctx,Index pos,
          vector<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
          *annotations,Type type)

{
  bool bVar1;
  optional<unsigned_char> oVar2;
  BasicType BVar3;
  optional<unsigned_short> oVar4;
  optional<unsigned_int> oVar5;
  optional<float> oVar6;
  string *this;
  long lVar7;
  optional<unsigned_long> oVar8;
  string_view expected;
  string_view expected_00;
  string_view expected_01;
  string_view expected_02;
  string_view expected_03;
  string_view expected_04;
  optional<double> oVar9;
  string local_1b8;
  string local_198;
  string local_178;
  string local_158;
  string local_138;
  string local_118;
  string local_f8;
  string local_d8;
  string local_b8;
  string local_98;
  string local_78;
  Type local_58;
  Type type_local;
  allocator<char> local_29;
  
  local_58.id = type.id;
  if (6 < type.id) {
    __assert_fail("type.isBasic()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/parser/parsers.h"
                  ,0x64f,
                  "Result<> wasm::WATParser::makeConst(Ctx &, Index, const std::vector<Annotation> &, Type) [Ctx = wasm::WATParser::ParseDeclsCtx]"
                 );
  }
  BVar3 = wasm::Type::getBasic(&local_58);
  switch(BVar3) {
  case i32:
    oVar5 = Lexer::takeI<unsigned_int>(&ctx->in);
    if (((ulong)oVar5.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                super__Optional_payload_base<unsigned_int> >> 0x20 & 1) != 0) {
LAB_00c19cd4:
      *(__index_type *)
       ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
               super__Move_assign_alias<wasm::Ok,_wasm::Err>.
               super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
               super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x20) = '\0';
      return __return_storage_ptr__;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1b8,"expected i32",&local_29);
    Lexer::err((Err *)&type_local,&ctx->in,&local_1b8);
    std::__detail::__variant::_Variant_storage<false,wasm::Ok,wasm::Err>::
    _Variant_storage<1ul,wasm::Err>
              ((_Variant_storage<false,wasm::Ok,wasm::Err> *)__return_storage_ptr__,&type_local);
    std::__cxx11::string::~string((string *)&type_local);
    this = &local_1b8;
    break;
  case i64:
    oVar8 = Lexer::takeI<unsigned_long>(&ctx->in);
    if (((undefined1  [16])
         oVar8.super__Optional_base<unsigned_long,_true,_true>._M_payload.
         super__Optional_payload_base<unsigned_long> & (undefined1  [16])0x1) !=
        (undefined1  [16])0x0) goto LAB_00c19cd4;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_198,"expected i64",&local_29);
    Lexer::err((Err *)&type_local,&ctx->in,&local_198);
    std::__detail::__variant::_Variant_storage<false,wasm::Ok,wasm::Err>::
    _Variant_storage<1ul,wasm::Err>
              ((_Variant_storage<false,wasm::Ok,wasm::Err> *)__return_storage_ptr__,&type_local);
    std::__cxx11::string::~string((string *)&type_local);
    this = &local_198;
    break;
  case f32:
    oVar6 = Lexer::takeF32(&ctx->in);
    if (((ulong)oVar6.super__Optional_base<float,_true,_true>._M_payload.
                super__Optional_payload_base<float> >> 0x20 & 1) != 0) goto LAB_00c19cd4;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_178,"expected f32",&local_29);
    Lexer::err((Err *)&type_local,&ctx->in,&local_178);
    std::__detail::__variant::_Variant_storage<false,wasm::Ok,wasm::Err>::
    _Variant_storage<1ul,wasm::Err>
              ((_Variant_storage<false,wasm::Ok,wasm::Err> *)__return_storage_ptr__,&type_local);
    std::__cxx11::string::~string((string *)&type_local);
    this = &local_178;
    break;
  case f64:
    oVar9 = Lexer::takeF64(&ctx->in);
    if (((undefined1  [16])
         oVar9.super__Optional_base<double,_true,_true>._M_payload.
         super__Optional_payload_base<double> & (undefined1  [16])0x1) != (undefined1  [16])0x0)
    goto LAB_00c19cd4;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_158,"expected f64",&local_29);
    Lexer::err((Err *)&type_local,&ctx->in,&local_158);
    std::__detail::__variant::_Variant_storage<false,wasm::Ok,wasm::Err>::
    _Variant_storage<1ul,wasm::Err>
              ((_Variant_storage<false,wasm::Ok,wasm::Err> *)__return_storage_ptr__,&type_local);
    std::__cxx11::string::~string((string *)&type_local);
    this = &local_158;
    break;
  case v128:
    expected._M_str = "i8x16";
    expected._M_len = 5;
    bVar1 = Lexer::takeKeyword(&ctx->in,expected);
    if (bVar1) {
      lVar7 = 0x11;
      do {
        lVar7 = lVar7 + -1;
        if (lVar7 == 0) goto LAB_00c19cd4;
        oVar2 = Lexer::takeI<unsigned_char>(&ctx->in);
      } while (((ushort)oVar2.super__Optional_base<unsigned_char,_true,_true>._M_payload.
                        super__Optional_payload_base<unsigned_char> >> 8 & 1) != 0);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_138,"expected i8 value",&local_29);
      Lexer::err((Err *)&type_local,&ctx->in,&local_138);
      std::__detail::__variant::_Variant_storage<false,wasm::Ok,wasm::Err>::
      _Variant_storage<1ul,wasm::Err>
                ((_Variant_storage<false,wasm::Ok,wasm::Err> *)__return_storage_ptr__,&type_local);
      std::__cxx11::string::~string((string *)&type_local);
      this = &local_138;
    }
    else {
      expected_00._M_str = "i16x8";
      expected_00._M_len = 5;
      bVar1 = Lexer::takeKeyword(&ctx->in,expected_00);
      if (bVar1) {
        lVar7 = 9;
        do {
          lVar7 = lVar7 + -1;
          if (lVar7 == 0) goto LAB_00c19cd4;
          oVar4 = Lexer::takeI<unsigned_short>(&ctx->in);
        } while (((uint)oVar4.super__Optional_base<unsigned_short,_true,_true>._M_payload.
                        super__Optional_payload_base<unsigned_short> >> 0x10 & 1) != 0);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_118,"expected i16 value",&local_29);
        Lexer::err((Err *)&type_local,&ctx->in,&local_118);
        std::__detail::__variant::_Variant_storage<false,wasm::Ok,wasm::Err>::
        _Variant_storage<1ul,wasm::Err>
                  ((_Variant_storage<false,wasm::Ok,wasm::Err> *)__return_storage_ptr__,&type_local)
        ;
        std::__cxx11::string::~string((string *)&type_local);
        this = &local_118;
      }
      else {
        lVar7 = 5;
        expected_01._M_str = "i32x4";
        expected_01._M_len = 5;
        bVar1 = Lexer::takeKeyword(&ctx->in,expected_01);
        if (bVar1) {
          do {
            lVar7 = lVar7 + -1;
            if (lVar7 == 0) goto LAB_00c19cd4;
            oVar5 = Lexer::takeI<unsigned_int>(&ctx->in);
          } while (((ulong)oVar5.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                           super__Optional_payload_base<unsigned_int> & 0x100000000) != 0);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_f8,"expected i32 value",&local_29);
          Lexer::err((Err *)&type_local,&ctx->in,&local_f8);
          std::__detail::__variant::_Variant_storage<false,wasm::Ok,wasm::Err>::
          _Variant_storage<1ul,wasm::Err>
                    ((_Variant_storage<false,wasm::Ok,wasm::Err> *)__return_storage_ptr__,
                     &type_local);
          std::__cxx11::string::~string((string *)&type_local);
          this = &local_f8;
        }
        else {
          expected_02._M_str = "i64x2";
          expected_02._M_len = 5;
          bVar1 = Lexer::takeKeyword(&ctx->in,expected_02);
          if (bVar1) {
            lVar7 = 3;
            do {
              lVar7 = lVar7 + -1;
              if (lVar7 == 0) goto LAB_00c19cd4;
              oVar8 = Lexer::takeI<unsigned_long>(&ctx->in);
            } while (((undefined1  [16])
                      oVar8.super__Optional_base<unsigned_long,_true,_true>._M_payload.
                      super__Optional_payload_base<unsigned_long> & (undefined1  [16])0x1) !=
                     (undefined1  [16])0x0);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_d8,"expected i64 value",&local_29);
            Lexer::err((Err *)&type_local,&ctx->in,&local_d8);
            std::__detail::__variant::_Variant_storage<false,wasm::Ok,wasm::Err>::
            _Variant_storage<1ul,wasm::Err>
                      ((_Variant_storage<false,wasm::Ok,wasm::Err> *)__return_storage_ptr__,
                       &type_local);
            std::__cxx11::string::~string((string *)&type_local);
            this = &local_d8;
          }
          else {
            expected_03._M_str = "f32x4";
            expected_03._M_len = 5;
            bVar1 = Lexer::takeKeyword(&ctx->in,expected_03);
            if (bVar1) {
              do {
                lVar7 = lVar7 + -1;
                if (lVar7 == 0) goto LAB_00c19cd4;
                oVar6 = Lexer::takeF32(&ctx->in);
              } while (((ulong)oVar6.super__Optional_base<float,_true,_true>._M_payload.
                               super__Optional_payload_base<float> & 0x100000000) != 0);
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_b8,"expected f32 value",&local_29);
              Lexer::err((Err *)&type_local,&ctx->in,&local_b8);
              std::__detail::__variant::_Variant_storage<false,wasm::Ok,wasm::Err>::
              _Variant_storage<1ul,wasm::Err>
                        ((_Variant_storage<false,wasm::Ok,wasm::Err> *)__return_storage_ptr__,
                         &type_local);
              std::__cxx11::string::~string((string *)&type_local);
              this = &local_b8;
            }
            else {
              expected_04._M_str = "f64x2";
              expected_04._M_len = 5;
              bVar1 = Lexer::takeKeyword(&ctx->in,expected_04);
              if (bVar1) {
                lVar7 = 3;
                do {
                  lVar7 = lVar7 + -1;
                  if (lVar7 == 0) goto LAB_00c19cd4;
                  oVar9 = Lexer::takeF64(&ctx->in);
                } while (((undefined1  [16])
                          oVar9.super__Optional_base<double,_true,_true>._M_payload.
                          super__Optional_payload_base<double> & (undefined1  [16])0x1) !=
                         (undefined1  [16])0x0);
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_98,"expected f64 value",&local_29);
                Lexer::err((Err *)&type_local,&ctx->in,&local_98);
                std::__detail::__variant::_Variant_storage<false,wasm::Ok,wasm::Err>::
                _Variant_storage<1ul,wasm::Err>
                          ((_Variant_storage<false,wasm::Ok,wasm::Err> *)__return_storage_ptr__,
                           &type_local);
                std::__cxx11::string::~string((string *)&type_local);
                this = &local_98;
              }
              else {
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_78,"expected SIMD vector shape",&local_29);
                Lexer::err((Err *)&type_local,&ctx->in,&local_78);
                std::__detail::__variant::_Variant_storage<false,wasm::Ok,wasm::Err>::
                _Variant_storage<1ul,wasm::Err>
                          ((_Variant_storage<false,wasm::Ok,wasm::Err> *)__return_storage_ptr__,
                           &type_local);
                std::__cxx11::string::~string((string *)&type_local);
                this = &local_78;
              }
            }
          }
        }
      }
    }
    break;
  default:
    handle_unreachable("unexpected type",
                       "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/parser/parsers.h"
                       ,0x6ad);
  }
  std::__cxx11::string::~string((string *)this);
  return __return_storage_ptr__;
}

Assistant:

Result<> makeConst(Ctx& ctx,
                   Index pos,
                   const std::vector<Annotation>& annotations,
                   Type type) {
  assert(type.isBasic());
  switch (type.getBasic()) {
    case Type::i32:
      if (auto c = ctx.in.takeI32()) {
        return ctx.makeI32Const(pos, annotations, *c);
      }
      return ctx.in.err("expected i32");
    case Type::i64:
      if (auto c = ctx.in.takeI64()) {
        return ctx.makeI64Const(pos, annotations, *c);
      }
      return ctx.in.err("expected i64");
    case Type::f32:
      if (auto c = ctx.in.takeF32()) {
        return ctx.makeF32Const(pos, annotations, *c);
      }
      return ctx.in.err("expected f32");
    case Type::f64:
      if (auto c = ctx.in.takeF64()) {
        return ctx.makeF64Const(pos, annotations, *c);
      }
      return ctx.in.err("expected f64");
    case Type::v128:
      if (ctx.in.takeKeyword("i8x16"sv)) {
        std::array<uint8_t, 16> vals;
        for (size_t i = 0; i < 16; ++i) {
          auto val = ctx.in.takeI8();
          if (!val) {
            return ctx.in.err("expected i8 value");
          }
          vals[i] = *val;
        }
        return ctx.makeI8x16Const(pos, annotations, vals);
      }
      if (ctx.in.takeKeyword("i16x8"sv)) {
        std::array<uint16_t, 8> vals;
        for (size_t i = 0; i < 8; ++i) {
          auto val = ctx.in.takeI16();
          if (!val) {
            return ctx.in.err("expected i16 value");
          }
          vals[i] = *val;
        }
        return ctx.makeI16x8Const(pos, annotations, vals);
      }
      if (ctx.in.takeKeyword("i32x4"sv)) {
        std::array<uint32_t, 4> vals;
        for (size_t i = 0; i < 4; ++i) {
          auto val = ctx.in.takeI32();
          if (!val) {
            return ctx.in.err("expected i32 value");
          }
          vals[i] = *val;
        }
        return ctx.makeI32x4Const(pos, annotations, vals);
      }
      if (ctx.in.takeKeyword("i64x2"sv)) {
        std::array<uint64_t, 2> vals;
        for (size_t i = 0; i < 2; ++i) {
          auto val = ctx.in.takeI64();
          if (!val) {
            return ctx.in.err("expected i64 value");
          }
          vals[i] = *val;
        }
        return ctx.makeI64x2Const(pos, annotations, vals);
      }
      if (ctx.in.takeKeyword("f32x4"sv)) {
        std::array<float, 4> vals;
        for (size_t i = 0; i < 4; ++i) {
          auto val = ctx.in.takeF32();
          if (!val) {
            return ctx.in.err("expected f32 value");
          }
          vals[i] = *val;
        }
        return ctx.makeF32x4Const(pos, annotations, vals);
      }
      if (ctx.in.takeKeyword("f64x2"sv)) {
        std::array<double, 2> vals;
        for (size_t i = 0; i < 2; ++i) {
          auto val = ctx.in.takeF64();
          if (!val) {
            return ctx.in.err("expected f64 value");
          }
          vals[i] = *val;
        }
        return ctx.makeF64x2Const(pos, annotations, vals);
      }
      return ctx.in.err("expected SIMD vector shape");
    case Type::none:
    case Type::unreachable:
      break;
  }
  WASM_UNREACHABLE("unexpected type");
}